

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_unrolled_binary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,bool negate,BaseType expected_type)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  bool local_405;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  uint local_31c;
  undefined1 local_318 [4];
  uint32_t i;
  string expr;
  SPIRType *type;
  undefined1 local_2e0 [8];
  SPIRType target_type1;
  SPIRType target_type0;
  SPIRType *type1;
  SPIRType *type0;
  bool negate_local;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op1);
  SPIRType::SPIRType((SPIRType *)&target_type1.member_name_cache._M_h._M_single_bucket,pSVar3);
  SPIRType::SPIRType((SPIRType *)local_2e0,pSVar4);
  target_type1.super_IVariant.self.id = expected_type;
  target_type1.basetype = Void;
  expr.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  type_to_glsl_constructor_abi_cxx11_((string *)local_318,this,(SPIRType *)expr.field_2._8_8_);
  ::std::__cxx11::string::operator+=((string *)local_318,'(');
  for (local_31c = 0; local_31c < *(uint *)(expr.field_2._8_8_ + 0x18); local_31c = local_31c + 1) {
    if (negate) {
      ::std::__cxx11::string::operator+=((string *)local_318,"!(");
    }
    if ((expected_type == Unknown) || (pSVar3->basetype == expected_type)) {
      to_extract_component_expression_abi_cxx11_(&local_380,this,op0,local_31c);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)&local_380);
      ::std::__cxx11::string::~string((string *)&local_380);
    }
    else {
      BVar1 = pSVar3->basetype;
      to_extract_component_expression_abi_cxx11_(&local_360,this,op0,local_31c);
      bitcast_expression(&local_340,this,
                         (SPIRType *)&target_type1.member_name_cache._M_h._M_single_bucket,BVar1,
                         &local_360);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)&local_340);
      ::std::__cxx11::string::~string((string *)&local_340);
      ::std::__cxx11::string::~string((string *)&local_360);
    }
    ::std::__cxx11::string::operator+=((string *)local_318,' ');
    ::std::__cxx11::string::operator+=((string *)local_318,op);
    ::std::__cxx11::string::operator+=((string *)local_318,' ');
    if ((expected_type == Unknown) || (pSVar4->basetype == expected_type)) {
      to_extract_component_expression_abi_cxx11_(&local_3e0,this,op1,local_31c);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)&local_3e0);
      ::std::__cxx11::string::~string((string *)&local_3e0);
    }
    else {
      BVar1 = pSVar4->basetype;
      to_extract_component_expression_abi_cxx11_(&local_3c0,this,op1,local_31c);
      bitcast_expression(&local_3a0,this,(SPIRType *)local_2e0,BVar1,&local_3c0);
      ::std::__cxx11::string::operator+=((string *)local_318,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3c0);
    }
    if (negate) {
      ::std::__cxx11::string::operator+=((string *)local_318,")");
    }
    if (local_31c + 1 < *(uint *)(expr.field_2._8_8_ + 0x18)) {
      ::std::__cxx11::string::operator+=((string *)local_318,", ");
    }
  }
  ::std::__cxx11::string::operator+=((string *)local_318,')');
  bVar2 = should_forward(this,op0);
  local_405 = false;
  if (bVar2) {
    local_405 = should_forward(this,op1);
  }
  emit_op(this,result_type,result_id,(string *)local_318,local_405,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  ::std::__cxx11::string::~string((string *)local_318);
  SPIRType::~SPIRType((SPIRType *)local_2e0);
  SPIRType::~SPIRType((SPIRType *)&target_type1.member_name_cache._M_h._M_single_bucket);
  return;
}

Assistant:

void CompilerGLSL::emit_unrolled_binary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           const char *op, bool negate, SPIRType::BaseType expected_type)
{
	auto &type0 = expression_type(op0);
	auto &type1 = expression_type(op1);

	SPIRType target_type0 = type0;
	SPIRType target_type1 = type1;
	target_type0.basetype = expected_type;
	target_type1.basetype = expected_type;
	target_type0.vecsize = 1;
	target_type1.vecsize = 1;

	auto &type = get<SPIRType>(result_type);
	auto expr = type_to_glsl_constructor(type);
	expr += '(';
	for (uint32_t i = 0; i < type.vecsize; i++)
	{
		// Make sure to call to_expression multiple times to ensure
		// that these expressions are properly flushed to temporaries if needed.
		if (negate)
			expr += "!(";

		if (expected_type != SPIRType::Unknown && type0.basetype != expected_type)
			expr += bitcast_expression(target_type0, type0.basetype, to_extract_component_expression(op0, i));
		else
			expr += to_extract_component_expression(op0, i);

		expr += ' ';
		expr += op;
		expr += ' ';

		if (expected_type != SPIRType::Unknown && type1.basetype != expected_type)
			expr += bitcast_expression(target_type1, type1.basetype, to_extract_component_expression(op1, i));
		else
			expr += to_extract_component_expression(op1, i);

		if (negate)
			expr += ")";

		if (i + 1 < type.vecsize)
			expr += ", ";
	}
	expr += ')';
	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}